

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableWriterFields
          (SwiftGenerator *this,FieldDef *field,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_body,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *create_header)

{
  IdlNamer *this_00;
  Value *type_00;
  CodeWriter *this_01;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  int iVar5;
  StructDef *def;
  uint uVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  ulong *puVar12;
  long *plVar13;
  char *pcVar14;
  char *pcVar15;
  undefined8 uVar16;
  ulong uVar17;
  _Alloc_hider _Var18;
  bool bVar19;
  string optional_enum;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string check_if_vector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string nullable_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string type;
  string builder_string;
  string field_var;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  string local_340;
  key_type local_320;
  string local_300;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  long lStack_2c8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_2c0;
  long *local_2b8 [2];
  long local_2a8 [2];
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  long *local_1f8 [2];
  long local_1e8 [2];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,", _ fbb: inout FlatBufferBuilder) { ","");
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_218,this_00,field);
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_238,this_00,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&local_278,this,&type_00->type,false);
  if ((field->presence == kOptional) && ((type_00->type).base_type - BASE_TYPE_UTYPE < 0xc)) {
    local_2b8[0] = local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    std::__cxx11::string::append((char *)local_2b8);
  }
  else {
    local_2b8[0] = local_2a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2b8,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
  }
  paVar3 = &local_320.field_2;
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"FIELDVAR","");
  local_1d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)create_body;
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_300,this_00,field);
  this_01 = &this->code_;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"VALUETYPE","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"OFFSET","");
  (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_300,this_00,field);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  local_320._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"CONSTANT","");
  SwiftConstant_abi_cxx11_(&local_300,this,field);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_01->value_map_,&local_320);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != paVar3) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  BVar4 = (type_00->type).base_type;
  pcVar15 = "VectorOf(";
  if (((BVar4 != BASE_TYPE_VECTOR) && (BVar4 != BASE_TYPE_VECTOR64)) &&
     (pcVar15 = "(", BVar4 == BASE_TYPE_ARRAY)) {
    pcVar15 = "VectorOf(";
  }
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  local_2c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)create_header;
  sVar8 = strlen(pcVar15);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,pcVar15,pcVar15 + sVar8);
  std::operator+(&local_3c0,"add",&local_320);
  plVar9 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_3c0,(ulong)local_218._M_dataplus._M_p);
  psVar11 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_380.field_2._M_allocated_capacity = *psVar11;
    local_380.field_2._8_8_ = plVar9[3];
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  }
  else {
    local_380.field_2._M_allocated_capacity = *psVar11;
    local_380._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_380._M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  psVar11 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_300.field_2._M_allocated_capacity = *psVar11;
    local_300.field_2._8_8_ = plVar9[3];
  }
  else {
    local_300.field_2._M_allocated_capacity = *psVar11;
    local_300._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_300._M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_3c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_380,"{{ACCESS_TYPE}} static func ",&local_300);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_380);
  psVar11 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_f0.field_2._M_allocated_capacity = *psVar11;
    local_f0.field_2._8_8_ = plVar9[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar11;
    local_f0._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_f0._M_string_length = plVar9[1];
  *plVar9 = (long)psVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  CodeWriter::operator+=(this_01,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_380.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_3a0,"{{STRUCTNAME}}.",&local_300);
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_218._M_dataplus._M_p);
  psVar11 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_3c0.field_2._M_allocated_capacity = *psVar11;
    local_3c0.field_2._8_8_ = puVar10[3];
    local_3c0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_3c0.field_2._M_allocated_capacity = *psVar11;
    local_3c0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_3c0._M_string_length = puVar10[1];
  *puVar10 = psVar11;
  puVar10[1] = 0;
  *(undefined1 *)(puVar10 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_380.field_2._M_allocated_capacity = *puVar12;
    local_380.field_2._8_8_ = plVar9[3];
    local_380._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_380.field_2._M_allocated_capacity = *puVar12;
    local_380._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_380._M_string_length = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(local_1d8,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != paVar2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  BVar4 = (type_00->type).base_type;
  uVar6 = BVar4 - BASE_TYPE_UTYPE;
  if (uVar6 < 0xc) {
    if (BVar4 == BASE_TYPE_BOOL) {
      SwiftConstant_abi_cxx11_(&local_380,this,field);
      local_3c0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"CONSTANT","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_01->value_map_,&local_3c0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      local_3c0._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"VALUETYPE","");
      bVar19 = field->presence == kOptional;
      pcVar15 = "Bool";
      if (bVar19) {
        pcVar15 = "Bool?";
      }
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3a0,pcVar15,pcVar15 + (ulong)bVar19 + 4);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_01->value_map_,&local_3c0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_3c0,"{{VALUETYPE}}",&local_258);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_150.field_2._M_allocated_capacity = *psVar11;
        local_150.field_2._8_8_ = plVar9[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar11;
        local_150._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_150._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(this_01,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      pcVar15 = " def: {{CONSTANT}},";
      if (field->presence == kOptional) {
        pcVar15 = "\\";
      }
      pcVar14 = pcVar15 + 0x13;
      if (field->presence == kOptional) {
        pcVar14 = pcVar15 + 1;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,pcVar15,pcVar14);
      CodeWriter::operator+=(this_01,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0," at: {{TABLEOFFSET}}.{{OFFSET}}.p) }","");
      CodeWriter::operator+=(this_01,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_360,local_238._M_dataplus._M_p,
                 local_238._M_dataplus._M_p + local_238._M_string_length);
      std::__cxx11::string::append((char *)&local_360);
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_2b8[0]);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_340.field_2._M_allocated_capacity = *psVar11;
        local_340.field_2._8_8_ = plVar9[3];
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      }
      else {
        local_340.field_2._M_allocated_capacity = *psVar11;
        local_340._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_340._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_3a0.field_2._M_allocated_capacity = *puVar12;
        local_3a0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *puVar12;
        local_3a0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3a0._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_2e0 = &local_2d0;
      if (field->presence == kOptional) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"nil","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,local_380._M_dataplus._M_p,
                   local_380._M_dataplus._M_p + local_380._M_string_length);
      }
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        uVar16 = local_3a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_2d8 + local_3a0._M_string_length) {
        uVar17 = 0xf;
        if (local_2e0 != &local_2d0) {
          uVar17 = local_2d0;
        }
        if (uVar17 < local_2d8 + local_3a0._M_string_length) goto LAB_002ed7bd;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_2e0,0,(char *)0x0,(ulong)local_3a0._M_dataplus._M_p);
      }
      else {
LAB_002ed7bd:
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_2e0)
        ;
      }
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_3c0.field_2._M_allocated_capacity = *psVar11;
        local_3c0.field_2._8_8_ = puVar10[3];
        local_3c0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar11;
        local_3c0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3c0._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)psVar11 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_2c0,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      uVar16 = local_360.field_2._M_allocated_capacity;
      _Var18._M_p = local_360._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_002ee130;
    }
    else {
      bVar19 = (field->value).type.enum_def != (EnumDef *)0x0;
      pcVar15 = "";
      if (uVar6 < 10 && bVar19) {
        pcVar15 = ".rawValue";
      }
      local_380._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_380,pcVar15,pcVar15 + (ulong)(uVar6 < 10 && bVar19) * 9);
      if (((field->value).type.enum_def == (EnumDef *)0x0) ||
         (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
        local_3c0._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
      }
      else {
        std::operator+(&local_3c0,"?",&local_380);
      }
      std::operator+(&local_3a0,"{{VALUETYPE}}",&local_258);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3a0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_110.field_2._M_allocated_capacity = *psVar11;
        local_110.field_2._8_8_ = plVar9[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *psVar11;
        local_110._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_110._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(this_01,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_298.field_2;
      local_298._M_dataplus._M_p = (pointer)paVar2;
      if (field->presence == kOptional) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_3c0._M_dataplus._M_p,
                   local_3c0._M_dataplus._M_p + local_3c0._M_string_length);
        std::__cxx11::string::append((char *)&local_298);
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_380._M_dataplus._M_p,
                   local_380._M_dataplus._M_p + local_380._M_string_length);
        std::__cxx11::string::append((char *)&local_298);
      }
      CodeWriter::operator+=(this_01,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != paVar2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }","");
      CodeWriter::operator+=(this_01,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (((field->value).type.enum_def == (EnumDef *)0x0) ||
         (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
        SwiftConstant_abi_cxx11_(&local_3a0,this,field);
      }
      else if (field->presence == kOptional) {
        local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"nil","");
      }
      else {
        GenEnumDefaultValue_abi_cxx11_(&local_3a0,this,field);
      }
      std::operator+(&local_50,"",&local_218);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar13 = plVar9 + 2;
      if ((long *)*plVar9 == plVar13) {
        local_120 = *plVar13;
        lStack_118 = plVar9[3];
        local_130 = &local_120;
      }
      else {
        local_120 = *plVar13;
        local_130 = (long *)*plVar9;
      }
      local_128 = plVar9[1];
      *plVar9 = (long)plVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_2b8[0]);
      puVar12 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar12) {
        local_2d0 = *puVar12;
        lStack_2c8 = plVar9[3];
        local_2e0 = &local_2d0;
      }
      else {
        local_2d0 = *puVar12;
        local_2e0 = (ulong *)*plVar9;
      }
      local_2d8 = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_2e0);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_360.field_2._M_allocated_capacity = *psVar11;
        local_360.field_2._8_8_ = puVar10[3];
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      }
      else {
        local_360.field_2._M_allocated_capacity = *psVar11;
        local_360._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_360._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      local_1f8[0] = local_1e8;
      if (field->presence == kOptional) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"nil","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,local_3a0._M_dataplus._M_p,
                   local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
      }
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_360,(ulong)local_1f8[0]);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_340.field_2._M_allocated_capacity = *psVar11;
        local_340.field_2._8_8_ = plVar9[3];
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
      }
      else {
        local_340.field_2._M_allocated_capacity = *psVar11;
        local_340._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_340._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_2c0,&local_340);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      uVar16 = local_3c0.field_2._M_allocated_capacity;
      _Var18._M_p = local_3c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p == paVar3) goto LAB_002ee130;
    }
LAB_002ee128:
    operator_delete(_Var18._M_p,uVar16 + 1);
LAB_002ee130:
    uVar16 = local_380.field_2._M_allocated_capacity;
    _Var18._M_p = local_380._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p == &local_380.field_2) goto LAB_002ee14c;
  }
  else {
    if ((BVar4 != BASE_TYPE_STRUCT) || (((field->value).type.struct_def)->fixed != true)) {
      (*(this_00->super_Namer)._vptr_Namer[7])(&local_3c0,this_00,field);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_380.field_2._M_allocated_capacity = *puVar12;
        local_380.field_2._8_8_ = plVar9[3];
        local_380._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_380.field_2._M_allocated_capacity = *puVar12;
        local_380._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_380._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      local_2e0 = &local_2d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_380._M_dataplus._M_p,
                 local_380._M_dataplus._M_p + local_380._M_string_length);
      std::__cxx11::string::append((char *)&local_2e0);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2e0,(ulong)local_238._M_dataplus._M_p);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_360.field_2._M_allocated_capacity = *psVar11;
        local_360.field_2._8_8_ = puVar10[3];
      }
      else {
        local_360.field_2._M_allocated_capacity = *psVar11;
        local_360._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_360._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_360);
      paVar3 = &local_340.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_340.field_2._M_allocated_capacity = *psVar11;
        local_340.field_2._8_8_ = plVar9[3];
        local_340._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_340.field_2._M_allocated_capacity = *psVar11;
        local_340._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_340._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_340);
      local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_3a0.field_2._M_allocated_capacity = *puVar12;
        local_3a0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_3a0.field_2._M_allocated_capacity = *puVar12;
        local_3a0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3a0._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3a0);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_3c0.field_2._M_allocated_capacity = *psVar11;
        local_3c0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar11;
        local_3c0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3c0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_2c0,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != paVar3) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0 + 1);
      }
      std::operator+(&local_3a0,"Offset",&local_258);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_3a0);
      local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_3c0.field_2._M_allocated_capacity = *psVar11;
        local_3c0.field_2._8_8_ = puVar10[3];
      }
      else {
        local_3c0.field_2._M_allocated_capacity = *psVar11;
        local_3c0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3c0._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_190.field_2._M_allocated_capacity = *psVar11;
        local_190.field_2._8_8_ = plVar9[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar11;
        local_190._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_190._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(this_01,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
        operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
      }
      if ((((field->value).type.element == BASE_TYPE_STRUCT) &&
          (def = (field->value).type.struct_def, def->fixed == true)) &&
         ((BVar4 = (type_00->type).base_type, BVar4 < (BASE_TYPE_VECTOR64|BASE_TYPE_UTYPE) &&
          ((0x64000U >> (BVar4 & (BASE_TYPE_UNION|BASE_TYPE_STRUCT)) & 1) != 0)))) {
        IdlNamer::NamespacedType_abi_cxx11_(&local_3c0,this_00,&def->super_Definition);
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"start_vector_of","");
        paVar2 = &local_3a0.field_2;
        Namer::Method(&local_340,&this_00->super_Namer,&local_360,&local_238);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_340,0,(char *)0x0,0x37b385);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_3a0.field_2._M_allocated_capacity = *psVar11;
          local_3a0.field_2._8_8_ = plVar9[3];
          local_3a0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *psVar11;
          local_3a0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_3a0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1b0.field_2._M_allocated_capacity = *psVar11;
          local_1b0.field_2._8_8_ = plVar9[3];
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        }
        else {
          local_1b0.field_2._M_allocated_capacity = *psVar11;
          local_1b0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1b0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        CodeWriter::operator+=(this_01,&local_1b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar3) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        piVar1 = &(this->code_).cur_ident_lvl_;
        *piVar1 = *piVar1 + 1;
        std::operator+(&local_360,"builder.startVector(size * MemoryLayout<",&local_3c0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_360);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_340.field_2._M_allocated_capacity = *psVar11;
          local_340.field_2._8_8_ = plVar9[3];
          local_340._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_340.field_2._M_allocated_capacity = *psVar11;
          local_340._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_340._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_340,(ulong)local_3c0._M_dataplus._M_p);
        puVar12 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_3a0.field_2._M_allocated_capacity = *puVar12;
          local_3a0.field_2._8_8_ = plVar9[3];
          local_3a0._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_3a0.field_2._M_allocated_capacity = *puVar12;
          local_3a0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_3a0._M_string_length = plVar9[1];
        *plVar9 = (long)puVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3a0);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_1d0.field_2._M_allocated_capacity = *psVar11;
          local_1d0.field_2._8_8_ = plVar9[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar11;
          local_1d0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1d0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        CodeWriter::operator+=(this_01,&local_1d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != paVar3) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        iVar5 = (this->code_).cur_ident_lvl_;
        if (iVar5 != 0) {
          (this->code_).cur_ident_lvl_ = iVar5 + -1;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"}","");
        CodeWriter::operator+=(this_01,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        uVar16 = local_3c0.field_2._M_allocated_capacity;
        _Var18._M_p = local_3c0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) goto LAB_002ee128;
      }
      goto LAB_002ee130;
    }
    local_3c0._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3c0,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    std::__cxx11::string::append((char *)&local_3c0);
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3c0,(ulong)local_258._M_dataplus._M_p);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_380.field_2._M_allocated_capacity = *psVar11;
      local_380.field_2._8_8_ = plVar9[3];
      local_380._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_380.field_2._M_allocated_capacity = *psVar11;
      local_380._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_380._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_380);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_170.field_2._M_allocated_capacity = *psVar11;
      local_170.field_2._8_8_ = plVar9[3];
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    }
    else {
      local_170.field_2._M_allocated_capacity = *psVar11;
      local_170._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_170._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    CodeWriter::operator+=(this_01,&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,local_238._M_dataplus._M_p,
               local_238._M_dataplus._M_p + local_238._M_string_length);
    std::__cxx11::string::append((char *)&local_3a0);
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_278._M_dataplus._M_p);
    psVar11 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_3c0.field_2._M_allocated_capacity = *psVar11;
      local_3c0.field_2._8_8_ = puVar10[3];
      local_3c0._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_3c0.field_2._M_allocated_capacity = *psVar11;
      local_3c0._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_3c0._M_string_length = puVar10[1];
    *puVar10 = psVar11;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    puVar12 = (ulong *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_380.field_2._M_allocated_capacity = *puVar12;
      local_380.field_2._8_8_ = plVar9[3];
    }
    else {
      local_380.field_2._M_allocated_capacity = *puVar12;
      local_380._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_380._M_string_length = plVar9[1];
    *plVar9 = (long)puVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_2c0,&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar3) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    uVar16 = local_3a0.field_2._M_allocated_capacity;
    _Var18._M_p = local_3a0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p == &local_3a0.field_2) goto LAB_002ee14c;
  }
  operator_delete(_Var18._M_p,uVar16 + 1);
LAB_002ee14c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenTableWriterFields(const FieldDef &field,
                            std::vector<std::string> *create_body,
                            std::vector<std::string> *create_header) {
    std::string builder_string = ", _ fbb: inout FlatBufferBuilder) { ";
    auto &create_func_body = *create_body;
    auto &create_func_header = *create_header;
    const auto field_field = namer_.Field(field);
    const auto field_var = namer_.Variable(field);
    const auto type = GenType(field.value.type);
    const auto opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    const auto nullable_type = opt_scalar ? type + "?" : type;
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("VALUETYPE", nullable_type);
    code_.SetValue("OFFSET", namer_.Field(field));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    std::string check_if_vector =
        (IsVector(field.value.type) || IsArray(field.value.type)) ? "VectorOf("
                                                                  : "(";
    const auto body = "add" + check_if_vector + field_field + ": ";
    code_ += "{{ACCESS_TYPE}} static func " + body + "\\";

    create_func_body.push_back("{{STRUCTNAME}}." + body + field_field +
                               ", &fbb)");

    if (IsScalar(field.value.type.base_type) &&
        !IsBool(field.value.type.base_type)) {
      const std::string is_enum = IsEnum(field.value.type) ? ".rawValue" : "";
      const std::string optional_enum =
          IsEnum(field.value.type) ? ("?" + is_enum) : "";
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}}\\";

      code_ += field.IsOptional() ? (optional_enum + "\\")
                                  : (is_enum + ", def: {{CONSTANT}}\\");

      code_ += ", at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";

      const auto default_value =
          IsEnum(field.value.type)
              ? (field.IsOptional() ? "nil" : GenEnumDefaultValue(field))
              : SwiftConstant(field);
      create_func_header.push_back(
          "" + field_field + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value = SwiftConstant(field);

      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", field.IsOptional() ? "Bool?" : "Bool");
      code_ +=
          "{{VALUETYPE}}" + builder_string + "fbb.add(element: {{FIELDVAR}},\\";
      code_ += field.IsOptional() ? "\\" : " def: {{CONSTANT}},";
      code_ += " at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
      create_func_header.push_back(
          field_var + ": " + nullable_type + " = " +
          (field.IsOptional() ? "nil" : default_value));
      return;
    }

    if (IsStruct(field.value.type)) {
      const auto create_struct =
          "guard let {{FIELDVAR}} = {{FIELDVAR}} else { return };"
          " fbb.create(struct: {{FIELDVAR}}, position: "
          "{{TABLEOFFSET}}.{{OFFSET}}.p) }";
      code_ += type + "?" + builder_string + create_struct;
      /// Optional hard coded since structs are always optional
      create_func_header.push_back(field_var + ": " + type +
                                   (field.IsOptional() ? "? = nil" : ""));
      return;
    }

    const auto arg_label =
        namer_.Variable(field) +
        (IsVector(field.value.type) || IsArray(field.value.type)
             ? "VectorOffset"
             : "Offset");
    create_func_header.push_back(arg_label + " " + field_var + ": " + "Offset" +
                                 (field.IsRequired() ? "" : " = Offset()"));
    const auto reader_type =
        IsStruct(field.value.type) && field.value.type.struct_def->fixed
            ? "structOffset: {{TABLEOFFSET}}.{{OFFSET}}.p) }"
            : "offset: {{FIELDVAR}}, at: {{TABLEOFFSET}}.{{OFFSET}}.p) }";
    code_ += "Offset" + builder_string + "fbb.add(" + reader_type;

    const auto vectortype = field.value.type.VectorType();

    if ((vectortype.base_type == BASE_TYPE_STRUCT &&
         field.value.type.struct_def->fixed) &&
        (IsVector(field.value.type) || IsArray(field.value.type))) {
      const auto field_name = namer_.NamespacedType(*vectortype.struct_def);
      code_ += "{{ACCESS_TYPE}} static func " +
               namer_.Method("start_vector_of", field_var) +
               "(_ size: Int, in builder: inout "
               "FlatBufferBuilder) {";
      Indent();
      code_ += "builder.startVector(size * MemoryLayout<" + field_name +
               ">.size, elementSize: MemoryLayout<" + field_name +
               ">.alignment)";
      Outdent();
      code_ += "}";
    }
  }